

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_soft.c
# Opt level: O0

void shader_grad_any_init(uintptr_t state,ALLEGRO_VERTEX *v1,ALLEGRO_VERTEX *v2,ALLEGRO_VERTEX *v3)

{
  ALLEGRO_BITMAP *pAVar1;
  float *in_RCX;
  float *in_RDX;
  float *in_RSI;
  undefined8 *in_RDI;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ALLEGRO_COLOR AVar12;
  state_grad_any_2d *s;
  float a_det_y;
  float a_det_x;
  float a_det;
  float b_det_y;
  float b_det_x;
  float b_det;
  float g_det_y;
  float g_det_x;
  float g_det;
  float r_det_y;
  float r_det_x;
  float r_det;
  ALLEGRO_COLOR v3c;
  ALLEGRO_COLOR v2c;
  ALLEGRO_COLOR v1c;
  float det_u;
  float x12;
  float x13;
  float x23;
  float y21;
  float y31;
  float y32;
  float minor3;
  float minor2;
  float minor1;
  float y3;
  float x3;
  float y2;
  float x2;
  float y1;
  float x1;
  undefined8 local_d8;
  undefined8 local_d0;
  float local_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float local_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float local_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  
  fVar2 = *in_RDX - *in_RSI;
  fVar3 = in_RDX[1] - in_RSI[1];
  fVar4 = *in_RCX - *in_RSI;
  fVar5 = in_RCX[1] - in_RSI[1];
  fVar6 = fVar3 * 0.0 + -(fVar2 * 0.0);
  fVar7 = fVar5 * 0.0 + -(fVar4 * 0.0);
  fVar8 = fVar2 * fVar5 + -(fVar4 * fVar3);
  fVar9 = fVar5 - fVar3;
  fVar5 = fVar5 - 0.0;
  fVar3 = fVar3 - 0.0;
  fVar10 = fVar2 - fVar4;
  fVar4 = 0.0 - fVar4;
  fVar2 = 0.0 - fVar2;
  fVar11 = (fVar8 - fVar6) + fVar7;
  local_70 = (float)*(undefined8 *)(in_RSI + 5);
  local_80 = (float)*(undefined8 *)(in_RDX + 5);
  local_90 = (float)*(undefined8 *)(in_RCX + 5);
  fStack_6c = (float)((ulong)*(undefined8 *)(in_RSI + 5) >> 0x20);
  fStack_7c = (float)((ulong)*(undefined8 *)(in_RDX + 5) >> 0x20);
  fStack_8c = (float)((ulong)*(undefined8 *)(in_RCX + 5) >> 0x20);
  local_68 = (float)*(undefined8 *)(in_RSI + 7);
  local_78 = (float)*(undefined8 *)(in_RDX + 7);
  local_88 = (float)*(undefined8 *)(in_RCX + 7);
  fStack_64 = (float)((ulong)*(undefined8 *)(in_RSI + 7) >> 0x20);
  fStack_74 = (float)((ulong)*(undefined8 *)(in_RDX + 7) >> 0x20);
  fStack_84 = (float)((ulong)*(undefined8 *)(in_RCX + 7) >> 0x20);
  pAVar1 = al_get_target_bitmap();
  *in_RDI = pAVar1;
  *(float *)(in_RDI + 0xd) = *in_RSI - 0.5;
  *(float *)((long)in_RDI + 0x6c) = in_RSI[1] + 0.5;
  if ((fVar11 != 0.0) || (NAN(fVar11))) {
    *(float *)(in_RDI + 3) = -(local_90 * fVar3 + local_70 * fVar9 + -(local_80 * fVar5)) / fVar11;
    *(float *)(in_RDI + 5) = -(local_90 * fVar2 + local_70 * fVar10 + -(local_80 * fVar4)) / fVar11;
    *(float *)(in_RDI + 7) = (local_90 * fVar6 + local_70 * fVar8 + -(local_80 * fVar7)) / fVar11;
    *(float *)((long)in_RDI + 0x1c) =
         -(fStack_8c * fVar3 + fStack_6c * fVar9 + -(fStack_7c * fVar5)) / fVar11;
    *(float *)((long)in_RDI + 0x2c) =
         -(fStack_8c * fVar2 + fStack_6c * fVar10 + -(fStack_7c * fVar4)) / fVar11;
    *(float *)((long)in_RDI + 0x3c) =
         (fStack_8c * fVar6 + fStack_6c * fVar8 + -(fStack_7c * fVar7)) / fVar11;
    *(float *)(in_RDI + 4) = -(local_88 * fVar3 + local_68 * fVar9 + -(local_78 * fVar5)) / fVar11;
    *(float *)(in_RDI + 6) = -(local_88 * fVar2 + local_68 * fVar10 + -(local_78 * fVar4)) / fVar11;
    *(float *)(in_RDI + 8) = (local_88 * fVar6 + local_68 * fVar8 + -(local_78 * fVar7)) / fVar11;
    *(float *)((long)in_RDI + 0x24) =
         -(fStack_84 * fVar3 + fStack_64 * fVar9 + -(fStack_74 * fVar5)) / fVar11;
    *(float *)((long)in_RDI + 0x34) =
         -(fStack_84 * fVar2 + fStack_64 * fVar10 + -(fStack_74 * fVar4)) / fVar11;
    *(float *)((long)in_RDI + 0x44) =
         (fStack_84 * fVar6 + fStack_64 * fVar8 + -(fStack_74 * fVar7)) / fVar11;
  }
  else {
    AVar12 = al_map_rgba_f(0.0,0.0,0.0,0.0);
    local_d8 = AVar12._0_8_;
    in_RDI[7] = local_d8;
    local_d0 = AVar12._8_8_;
    in_RDI[8] = local_d0;
    in_RDI[5] = in_RDI[7];
    in_RDI[6] = in_RDI[8];
    in_RDI[3] = in_RDI[5];
    in_RDI[4] = in_RDI[6];
  }
  return;
}

Assistant:

static void shader_grad_any_init(uintptr_t state, ALLEGRO_VERTEX* v1, ALLEGRO_VERTEX* v2, ALLEGRO_VERTEX* v3)
{
   INIT_PREAMBLE

   ALLEGRO_COLOR v1c = v1->color;
   ALLEGRO_COLOR v2c = v2->color;
   ALLEGRO_COLOR v3c = v3->color;

   PLANE_DETS(r, v1c.r, v2c.r, v3c.r)
   PLANE_DETS(g, v1c.g, v2c.g, v3c.g)
   PLANE_DETS(b, v1c.b, v2c.b, v3c.b)
   PLANE_DETS(a, v1c.a, v2c.a, v3c.a)

   state_grad_any_2d* s = (state_grad_any_2d*)state;

   s->solid.target = al_get_target_bitmap();
   
   s->off_x = v1->x - 0.5f;
   s->off_y = v1->y + 0.5f;

   if (det_u == 0.0) {
      s->color_dx = s->color_dy = s->color_const = al_map_rgba_f(0, 0, 0, 0);
   }
   else {
      s->color_dx.r    = -r_det_x / det_u;
      s->color_dy.r    = -r_det_y / det_u;
      s->color_const.r = r_det / det_u;

      s->color_dx.g    = -g_det_x / det_u;
      s->color_dy.g    = -g_det_y / det_u;
      s->color_const.g = g_det / det_u;

      s->color_dx.b    = -b_det_x / det_u;
      s->color_dy.b    = -b_det_y / det_u;
      s->color_const.b = b_det / det_u;

      s->color_dx.a    = -a_det_x / det_u;
      s->color_dy.a    = -a_det_y / det_u;
      s->color_const.a = a_det / det_u;
   }
}